

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taylor_math.hpp
# Opt level: O3

void atan_taylor<double,6>(taylor<double,_1,_6> *t,double *a)

{
  undefined1 auVar1 [16];
  long lVar2;
  int iVar3;
  uint uVar5;
  double dVar4;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  taylor<double,_1,_6> invt;
  double local_98;
  double dStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  taylor<double,_1,_6> local_58;
  
  local_58.super_polynomial<double,_1,_6>.c[4] = 0.0;
  local_58.super_polynomial<double,_1,_6>.c[5] = 0.0;
  local_58.super_polynomial<double,_1,_6>.c[2] = 0.0;
  local_58.super_polynomial<double,_1,_6>.c[3] = 0.0;
  local_58.super_polynomial<double,_1,_6>.c[0] = 0.0;
  local_58.super_polynomial<double,_1,_6>.c[1] = 0.0;
  local_58.super_polynomial<double,_1,_6>.c[6] = 0.0;
  inv_taylor<double,6>(&local_58,a);
  local_68 = 0;
  local_78 = 0;
  uStack_70 = 0;
  uStack_80 = 0;
  local_98 = 0.0;
  dStack_90 = *a + *a;
  local_88 = 0x3ff0000000000000;
  polymul_internal::composer<double,_1,_6,_6>::compose0((double *)t,&local_98,(double *)&local_58);
  auVar1 = _DAT_00121090;
  iVar3 = 6;
  uVar5 = 5;
  lVar2 = 4;
  do {
    auVar6._4_4_ = 0;
    auVar6._0_4_ = uVar5;
    auVar6._8_4_ = iVar3;
    auVar6._12_4_ = 0;
    auVar7._0_8_ = SUB168(auVar6 | auVar1,0) - 4503599627370496.0;
    auVar7._8_8_ = SUB168(auVar6 | auVar1,8) - 4503599627370496.0;
    auVar6 = divpd(*(undefined1 (*) [16])((t->super_polynomial<double,_1,_6>).c + lVar2),auVar7);
    *(undefined1 (*) [16])((t->super_polynomial<double,_1,_6>).c + lVar2 + 1) = auVar6;
    iVar3 = iVar3 + -2;
    uVar5 = uVar5 - 2;
    lVar2 = lVar2 + -2;
  } while (lVar2 != -2);
  (t->super_polynomial<double,_1,_6>).c[0] = 0.0;
  dVar4 = atan(*a);
  (t->super_polynomial<double,_1,_6>).c[0] = dVar4;
  return;
}

Assistant:

static void atan_taylor(taylor<T, 1, Ndeg> & t, const T & a) {
  // Calculate taylor expansion of 1/(1+a^2+x)
  taylor<T, 1, Ndeg> invt, x;
  inv_taylor(invt, 1 + a * a);
  // insert x = 2*a*x + x^2
  x = 0;
  if (Ndeg > 0)
    x[1] = 2 * a;
  if (Ndeg > 1)
    x[2] = 1;
  x.compose0(t, invt);
  // Integrate each term and set the constant
  t.integrate();
  t[0] = atan(a);
}